

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_pack_tricore(uint32_t carry,uint32_t r1_low,uint32_t r1_high,
                            target_ulong_conflict r2)

{
  uint uVar1;
  uint32_t uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint32_t value;
  
  uVar5 = 0;
  if ((char)r1_low < '\0') {
    if ((r1_low & 0x17f) == 0) {
      uVar5 = (uint)(carry != 0);
    }
    else {
      uVar5 = 1;
    }
  }
  if (r1_high == 0xff && (r1_low & 0x80000000) == 0) {
    uVar1 = extract32(r1_low,8,0x17);
    iVar4 = 0x7f800000;
  }
  else {
    bVar3 = (byte)(r1_low >> 0x1f);
    if ((bVar3 & 0x7e < (int)r1_high) == 0) {
      uVar1 = 0;
      if (r1_low == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        if ((bVar3 & (int)r1_high < -0x7f) == 0) {
          uVar2 = extract32(r1_low,8,0x17);
          value = (((r1_high & 0xff) << 0x17 ^ 0x40000000) & (int)r1_low >> 0x1f | uVar2) + uVar5;
          uVar2 = extract32(value,0x17,8);
          uVar1 = extract32(value,0,0x17);
          iVar4 = uVar2 << 0x17;
        }
      }
    }
    else {
      iVar4 = 0x7f800000;
      uVar1 = 0;
    }
  }
  return (r2 & 0x80000000) + iVar4 | uVar1;
}

Assistant:

uint32_t helper_pack(uint32_t carry, uint32_t r1_low, uint32_t r1_high,
                     target_ulong r2)
{
    uint32_t ret;
    int32_t fp_exp, fp_frac, temp_exp, fp_exp_frac;
    int32_t int_exp  = r1_high;
    int32_t int_mant = r1_low;
    uint32_t flag_rnd = (int_mant & (1 << 7)) && (
                        (int_mant & (1 << 8)) ||
                        (int_mant & 0x7f)     ||
                        (carry != 0));
    if (((int_mant & (1<<31)) == 0) && (int_exp == 255)) {
        fp_exp = 255;
        fp_frac = extract32(int_mant, 8, 23);
    } else if ((int_mant & (1<<31)) && (int_exp >= 127)) {
        fp_exp  = 255;
        fp_frac = 0;
    } else if ((int_mant & (1<<31)) && (int_exp <= -128)) {
        fp_exp  = 0;
        fp_frac = 0;
    } else if (int_mant == 0) {
        fp_exp  = 0;
        fp_frac = 0;
    } else {
        if (((int_mant & (1 << 31)) == 0)) {
            temp_exp = 0;
        } else {
            temp_exp = int_exp + 128;
        }
        fp_exp_frac = (((temp_exp & 0xff) << 23) |
                      extract32(int_mant, 8, 23))
                      + flag_rnd;
        fp_exp  = extract32(fp_exp_frac, 23, 8);
        fp_frac = extract32(fp_exp_frac, 0, 23);
    }
    ret = r2 & (1 << 31);
    ret = ret + (fp_exp << 23);
    ret = ret + (fp_frac & 0x7fffff);

    return ret;
}